

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void emit_destructor_code(FILE *out,symbol *sp,lemon *lemp,int *lineno)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  
  if (sp->type == TERMINAL) {
    pcVar2 = lemp->tokendest;
    if (pcVar2 == (char *)0x0) {
      return;
    }
  }
  else {
    pcVar2 = sp->destructor;
    if (pcVar2 != (char *)0x0) {
      fwrite("{\n",2,1,(FILE *)out);
      iVar3 = *lineno;
      *lineno = iVar3 + 1;
      if (lemp->nolinenosflag == 0) {
        *lineno = iVar3 + 2;
        tplt_linedir(out,sp->destLineno,lemp->filename);
      }
      goto LAB_0010a328;
    }
    pcVar2 = lemp->vardest;
    if (pcVar2 == (char *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/tools/lemon/lemon.c"
                    ,0xd77,
                    "void emit_destructor_code(FILE *, struct symbol *, struct lemon *, int *)");
    }
  }
  fwrite("{\n",2,1,(FILE *)out);
  *lineno = *lineno + 1;
LAB_0010a328:
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '\n') {
      *lineno = *lineno + 1;
      cVar1 = *pcVar2;
LAB_0010a360:
      fputc((int)cVar1,(FILE *)out);
    }
    else {
      if (cVar1 != '$') {
        if (cVar1 == '\0') {
          fputc(10,(FILE *)out);
          iVar3 = *lineno;
          *lineno = iVar3 + 1;
          if (lemp->nolinenosflag == 0) {
            iVar3 = iVar3 + 2;
            *lineno = iVar3;
            tplt_linedir(out,iVar3,lemp->outname);
          }
          fwrite("}\n",2,1,(FILE *)out);
          *lineno = *lineno + 1;
          return;
        }
        goto LAB_0010a360;
      }
      cVar1 = '$';
      if (pcVar2[1] != '$') goto LAB_0010a360;
      pcVar2 = pcVar2 + 1;
      fprintf((FILE *)out,"(yypminor->yy%d)",(ulong)(uint)sp->dtnum);
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

void emit_destructor_code(
  FILE *out,
  struct symbol *sp,
  struct lemon *lemp,
  int *lineno
){
 char *cp = 0;

 if( sp->type==TERMINAL ){
   cp = lemp->tokendest;
   if( cp==0 ) return;
   fprintf(out,"{\n"); (*lineno)++;
 }else if( sp->destructor ){
   cp = sp->destructor;
   fprintf(out,"{\n"); (*lineno)++;
   if( !lemp->nolinenosflag ){
     (*lineno)++;
     tplt_linedir(out,sp->destLineno,lemp->filename);
   }
 }else if( lemp->vardest ){
   cp = lemp->vardest;
   if( cp==0 ) return;
   fprintf(out,"{\n"); (*lineno)++;
 }else{
   assert( 0 );  /* Cannot happen */
 }
 for(; *cp; cp++){
   if( *cp=='$' && cp[1]=='$' ){
     fprintf(out,"(yypminor->yy%d)",sp->dtnum);
     cp++;
     continue;
   }
   if( *cp=='\n' ) (*lineno)++;
   fputc(*cp,out);
 }
 fprintf(out,"\n"); (*lineno)++;
 if (!lemp->nolinenosflag) {
   (*lineno)++; tplt_linedir(out,*lineno,lemp->outname);
 }
 fprintf(out,"}\n"); (*lineno)++;
 return;
}